

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.c
# Opt level: O2

_Bool gb_timer_should_increment_tima(Timer *timer,MemoryBankController *mc)

{
  byte b;
  _Bool _Var1;
  undefined1 uVar2;
  
  b = (*mc->read)(mc,0xff07);
  _Var1 = test_bit_16bit(mc->div_register,*(int *)(&DAT_0010642c + (ulong)(b & 3) * 4));
  if (_Var1) {
    _Var1 = test_bit_8bit(b,2);
    if (_Var1) {
      _Var1 = true;
      uVar2 = 0;
      goto LAB_00102aa0;
    }
  }
  uVar2 = timer->prev_delay;
  _Var1 = false;
LAB_00102aa0:
  timer->prev_delay = _Var1;
  return (_Bool)uVar2;
}

Assistant:

bool gb_timer_should_increment_tima(Timer* timer, MemoryBankController* mc) {

    const uint8_t timer_control = mc->read(mc, TAC);
    const uint8_t clock_select = (uint8_t) (timer_control & 0x03u);
    int n = 0;

    switch(clock_select) {
        case 0:
            n = 9;
            break;
        case 1:
            n = 3;
            break;
        case 2:
            n = 5;
            break;
        case 3:
            n = 7;
            break;
        default:
            n = 9;
            break;
    }

    bool value = test_bit_16bit(mc->div_register, n) && test_bit_8bit(timer_control, 2);
    if(!value && timer->prev_delay) {
        timer->prev_delay = value;
        return true;
    }

    timer->prev_delay = value;
    return false;
}